

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::clipping::anon_unknown_0::ClipDistance::testClipDistance
          (TestStatus *__return_storage_ptr__,ClipDistance *this,Context *context,
          CaseDefinition caseDef)

{
  ostringstream *this_00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var1;
  uint uVar2;
  FeatureFlags flags;
  Context *pCVar3;
  Context *context_00;
  int iVar4;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  const_iterator cVar5;
  TestLog *pTVar6;
  TestStatus *pTVar7;
  ulong uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  int iVar10;
  int i;
  int iVar11;
  float fVar12;
  float fVar13;
  vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> shaders;
  VulkanProgram vulkanProgram;
  DrawCallData drawCallData;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  VulkanDrawContext drawContext;
  DrawState drawState;
  vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> local_768;
  TestStatus *local_748;
  ulong local_740;
  ulong local_738;
  Context *local_730;
  ulong local_728;
  Context *local_720;
  VulkanProgram local_718;
  DrawCallData local_710;
  void *local_708;
  undefined8 uStack_700;
  long local_6f8;
  ConstPixelBufferAccess local_6f0;
  undefined1 local_6c8 [24];
  int aiStack_6b0 [4];
  undefined1 local_6a0 [8];
  undefined1 local_698 [8];
  ProgramBinary *pPStack_690;
  TestLog local_688;
  int iStack_680;
  int local_67c;
  void *local_678;
  ios_base local_620 [272];
  undefined1 local_510 [8];
  float local_508;
  float fStack_504;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_500 [6];
  ios_base local_498 [604];
  uint local_23c;
  uint local_238;
  uint local_234;
  ConstPixelBufferAccess local_1d8;
  undefined1 local_1b0 [384];
  
  uVar8 = caseDef._0_8_;
  local_748 = __return_storage_ptr__;
  vk = Context::getInstanceInterface((Context *)this);
  local_720 = (Context *)this;
  physicalDevice = Context::getPhysicalDevice((Context *)this);
  ::vk::getPhysicalDeviceProperties((VkPhysicalDeviceProperties *)local_510,vk,physicalDevice);
  iVar4 = (uint)(0 < (int)caseDef.topology) * 0x200;
  iVar11 = iVar4 + 0x400;
  if (caseDef._4_4_ == 0 || (long)uVar8 < 0) {
    iVar11 = iVar4;
  }
  local_738 = (ulong)context & 0x10000000000;
  uVar2 = (uint)(local_738 >> 0x20);
  flags = iVar11 + 2 + (uVar2 >> 8);
  if (((ulong)context >> 0x30 & 1) == 0) {
    flags = iVar11 + (uVar2 >> 8);
  }
  local_730 = context;
  local_728 = uVar8 >> 0x20;
  requireFeatures(vk,physicalDevice,flags);
  context_00 = local_720;
  if (((int)caseDef.topology < 1) || (7 < local_23c)) {
    if (((int)local_728 < 1) || (7 < local_238)) {
      if (((int)local_728 < 1) || (7 < local_234)) {
        local_768.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_768.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
        _M_impl.super__Vector_impl_data._M_finish = (Shader *)0x0;
        local_768.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (Shader *)0x0;
        p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  *)local_720->m_progCollection;
        local_510 = (undefined1  [8])local_500;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_510,"vert","");
        cVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                ::find(p_Var1,(key_type *)local_510);
        pCVar3 = local_730;
        pPStack_690 = *(ProgramBinary **)(cVar5._M_node + 2);
        local_698._0_4_ = VK_SHADER_STAGE_VERTEX_BIT;
        local_740 = uVar8;
        if (local_768.
            super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_768.
            super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
          _M_realloc_insert<vkt::drawutil::Shader>
                    (&local_768,
                     (iterator)
                     local_768.
                     super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(Shader *)local_698);
        }
        else {
          *(undefined1 (*) [8])
           local_768.
           super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl
           .super__Vector_impl_data._M_finish = local_698;
          (local_768.
           super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl
           .super__Vector_impl_data._M_finish)->binary = pPStack_690;
          local_768.
          super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_768.
               super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        if (local_510 != (undefined1  [8])local_500) {
          operator_delete((void *)local_510,local_500[0]._M_allocated_capacity + 1);
        }
        p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  *)context_00->m_progCollection;
        local_510 = (undefined1  [8])local_500;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_510,"frag","");
        cVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                ::find(p_Var1,(key_type *)local_510);
        pPStack_690 = *(ProgramBinary **)(cVar5._M_node + 2);
        local_698._0_4_ = VK_SHADER_STAGE_FRAGMENT_BIT;
        if (local_768.
            super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_768.
            super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
          _M_realloc_insert<vkt::drawutil::Shader>
                    (&local_768,
                     (iterator)
                     local_768.
                     super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(Shader *)local_698);
        }
        else {
          *(undefined1 (*) [8])
           local_768.
           super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl
           .super__Vector_impl_data._M_finish = local_698;
          (local_768.
           super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl
           .super__Vector_impl_data._M_finish)->binary = pPStack_690;
          local_768.
          super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_768.
               super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        if (local_510 != (undefined1  [8])local_500) {
          operator_delete((void *)local_510,local_500[0]._M_allocated_capacity + 1);
        }
        if (local_738 != 0) {
          p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                    *)context_00->m_progCollection;
          local_510 = (undefined1  [8])local_500;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_510,"tesc","");
          cVar5 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  ::find(p_Var1,(key_type *)local_510);
          pPStack_690 = *(ProgramBinary **)(cVar5._M_node + 2);
          local_698._0_4_ = VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT;
          if (local_768.
              super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_768.
              super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
            _M_realloc_insert<vkt::drawutil::Shader>
                      (&local_768,
                       (iterator)
                       local_768.
                       super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(Shader *)local_698);
          }
          else {
            *(undefined1 (*) [8])
             local_768.
             super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
             _M_impl.super__Vector_impl_data._M_finish = local_698;
            (local_768.
             super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
             _M_impl.super__Vector_impl_data._M_finish)->binary = pPStack_690;
            local_768.
            super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_768.
                 super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          if (local_510 != (undefined1  [8])local_500) {
            operator_delete((void *)local_510,local_500[0]._M_allocated_capacity + 1);
          }
          p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                    *)context_00->m_progCollection;
          local_510 = (undefined1  [8])local_500;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_510,"tese","");
          cVar5 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  ::find(p_Var1,(key_type *)local_510);
          pPStack_690 = *(ProgramBinary **)(cVar5._M_node + 2);
          local_698._0_4_ = VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT;
          if (local_768.
              super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_768.
              super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
            _M_realloc_insert<vkt::drawutil::Shader>
                      (&local_768,
                       (iterator)
                       local_768.
                       super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(Shader *)local_698);
          }
          else {
            *(undefined1 (*) [8])
             local_768.
             super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
             _M_impl.super__Vector_impl_data._M_finish = local_698;
            (local_768.
             super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
             _M_impl.super__Vector_impl_data._M_finish)->binary = pPStack_690;
            local_768.
            super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_768.
                 super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          if (local_510 != (undefined1  [8])local_500) {
            operator_delete((void *)local_510,local_500[0]._M_allocated_capacity + 1);
          }
        }
        if (((ulong)pCVar3 >> 0x30 & 1) != 0) {
          p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                    *)context_00->m_progCollection;
          local_510 = (undefined1  [8])local_500;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_510,"geom","");
          cVar5 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  ::find(p_Var1,(key_type *)local_510);
          pPStack_690 = *(ProgramBinary **)(cVar5._M_node + 2);
          local_698._0_4_ = VK_SHADER_STAGE_GEOMETRY_BIT;
          if (local_768.
              super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_768.
              super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
            _M_realloc_insert<vkt::drawutil::Shader>
                      (&local_768,
                       (iterator)
                       local_768.
                       super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(Shader *)local_698);
          }
          else {
            *(undefined1 (*) [8])
             local_768.
             super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
             _M_impl.super__Vector_impl_data._M_finish = local_698;
            (local_768.
             super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
             _M_impl.super__Vector_impl_data._M_finish)->binary = pPStack_690;
            local_768.
            super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_768.
                 super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          if (local_510 != (undefined1  [8])local_500) {
            operator_delete((void *)local_510,local_500[0]._M_allocated_capacity + 1);
          }
        }
        local_708 = (void *)0x0;
        uStack_700 = 0;
        local_6f8 = 0;
        iVar11 = 0;
        do {
          fVar12 = (float)iVar11 * 0.25 + -1.0;
          local_510._4_4_ = -1.0;
          local_508 = 0.0;
          fStack_504 = 1.0;
          local_510._0_4_ = fVar12;
          std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
          emplace_back<tcu::Vector<float,4>>
                    ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_708
                     ,(Vector<float,_4> *)local_510);
          local_510._4_4_ = 1.0;
          local_508 = 0.0;
          fStack_504 = 1.0;
          local_510._0_4_ = fVar12;
          std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
          emplace_back<tcu::Vector<float,4>>
                    ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_708
                     ,(Vector<float,_4> *)local_510);
          fVar13 = fVar12 + 0.25;
          local_510._4_4_ = -1.0;
          local_508 = 0.0;
          fStack_504 = 1.0;
          local_510._0_4_ = fVar13;
          std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
          emplace_back<tcu::Vector<float,4>>
                    ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_708
                     ,(Vector<float,_4> *)local_510);
          local_510._4_4_ = 1.0;
          local_508 = 0.0;
          fStack_504 = 1.0;
          local_510._0_4_ = fVar12;
          std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
          emplace_back<tcu::Vector<float,4>>
                    ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_708
                     ,(Vector<float,_4> *)local_510);
          local_510._4_4_ = 1.0;
          local_508 = 0.0;
          fStack_504 = 1.0;
          local_510._0_4_ = fVar13;
          std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
          emplace_back<tcu::Vector<float,4>>
                    ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_708
                     ,(Vector<float,_4> *)local_510);
          local_510._4_4_ = -1.0;
          local_508 = 0.0;
          fStack_504 = 1.0;
          local_510._0_4_ = fVar13;
          std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
          emplace_back<tcu::Vector<float,4>>
                    ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_708
                     ,(Vector<float,_4> *)local_510);
          iVar11 = iVar11 + 1;
        } while (iVar11 != 8);
        local_1b0._0_8_ = context_00->m_testCtx->m_log;
        this_00 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Drawing ",8);
        std::ostream::operator<<(this_00,8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00," colored bars, clipping the first ",0x22);
        std::ostream::operator<<(this_00,(int)local_740);
        local_698 = (undefined1  [8])
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_1b0,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pPStack_690);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pPStack_690,"Using ",6);
        std::ostream::operator<<((ostringstream *)&pPStack_690,(int)local_740);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pPStack_690," ClipDistance(s) and ",0x15);
        std::ostream::operator<<((ostringstream *)&pPStack_690,(int)local_728);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pPStack_690," CullDistance(s)",0x10);
        pTVar6 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_698,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
        local_510._0_4_ = SUB84(pTVar6,0);
        local_510._4_4_ = (undefined4)((ulong)pTVar6 >> 0x20);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_508);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_508,"Expecting upper half of the clipped bars to be black.",
                   0x35);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_510,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_508);
        std::ios_base::~ios_base(local_498);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pPStack_690);
        std::ios_base::~ios_base(local_620);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
        drawutil::DrawState::DrawState
                  ((DrawState *)local_1b0,(VkPrimitiveTopology)local_730,0x10,0x10);
        uVar8 = local_740;
        pTVar7 = local_748;
        local_718.shaders = &local_768;
        if (local_738 != 0) {
          local_1b0._24_4_ = 3;
        }
        local_710.vertices =
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_708;
        drawutil::VulkanDrawContext::VulkanDrawContext
                  ((VulkanDrawContext *)local_510,context_00,(DrawState *)local_1b0,&local_710,
                   &local_718);
        drawutil::VulkanDrawContext::draw((VulkanDrawContext *)local_510);
        drawutil::VulkanDrawContext::getColorPixels(&local_6f0,(VulkanDrawContext *)local_510);
        local_6c8._16_4_ = 0;
        local_6c8._20_4_ = 0;
        aiStack_6b0[0] = 0;
        aiStack_6b0[1] = 0x3f800000;
        local_6c8._0_4_ = R;
        local_6c8._4_4_ = SNORM_INT8;
        local_6c8._8_4_ = 0;
        local_6c8._12_4_ = 0;
        local_698._0_4_ = local_6f0.m_format.order;
        local_698._4_4_ = local_6f0.m_format.type;
        local_688.m_log._0_4_ = local_6f0.m_size.m_data[2];
        local_688.m_log._4_4_ = local_6f0.m_pitch.m_data[0];
        iStack_680 = local_6f0.m_pitch.m_data[1];
        local_67c = local_6f0.m_pitch.m_data[2];
        local_678 = local_6f0.m_data;
        local_6a0._0_4_ = R;
        local_6a0._4_4_ = SNORM_INT8;
        iVar11 = countPixels((anon_unknown_0 *)local_698,(ConstPixelBufferAccess *)local_6a0,
                             (IVec2 *)(ulong)(uint)local_6f0.m_size.m_data[0],
                             (IVec2 *)(ulong)(uint)local_6f0.m_size.m_data[1],
                             (Vec4 *)(local_6c8 + 0x10),(Vec4 *)local_6c8);
        drawutil::VulkanDrawContext::getColorPixels(&local_1d8,(VulkanDrawContext *)local_510);
        iVar10 = (int)uVar8 * 0x10;
        local_6c8._0_4_ = R;
        local_6c8._4_4_ = UNORM_SHORT_565;
        local_698 = (undefined1  [8])0x0;
        pPStack_690 = (ProgramBinary *)0x3f80000000000000;
        local_6c8._16_4_ = 0;
        local_6c8._20_4_ = 0;
        aiStack_6b0[0] = 0;
        aiStack_6b0[1] = 0;
        iVar4 = countPixels((anon_unknown_0 *)&local_1d8,(ConstPixelBufferAccess *)local_6c8,
                            (IVec2 *)(ulong)(uint)(iVar10 >> 3),(IVec2 *)0x8,(Vec4 *)local_698,
                            (Vec4 *)(local_6c8 + 0x10));
        if ((iVar11 == iVar10) && (iVar4 == 0)) {
          local_698 = (undefined1  [8])&local_688;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"OK","");
          pTVar7->m_code = QP_TEST_RESULT_PASS;
          (pTVar7->m_description)._M_dataplus._M_p = (pointer)&(pTVar7->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&pTVar7->m_description,local_698,
                     (long)(qpTestLog **)local_698 + (long)&pPStack_690->m_format);
        }
        else {
          local_698 = (undefined1  [8])&local_688;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_698,"Rendered image(s) are incorrect","");
          pTVar7->m_code = QP_TEST_RESULT_FAIL;
          (pTVar7->m_description)._M_dataplus._M_p = (pointer)&(pTVar7->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&pTVar7->m_description,local_698,
                     (long)(qpTestLog **)local_698 + (long)&pPStack_690->m_format);
        }
        if (local_698 != (undefined1  [8])&local_688) {
          operator_delete((void *)local_698,CONCAT44(local_688.m_log._4_4_,(int)local_688.m_log) + 1
                         );
        }
        drawutil::VulkanDrawContext::~VulkanDrawContext((VulkanDrawContext *)local_510);
        if (local_708 != (void *)0x0) {
          operator_delete(local_708,local_6f8 - (long)local_708);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_768.
               super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
               _M_impl.super__Vector_impl_data._M_start ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          return pTVar7;
        }
        uVar8 = (long)local_768.
                      super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                (long)local_768.
                      super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_768.
                    super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_003b9ef1;
      }
      local_510 = (undefined1  [8])local_500;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_510,
                 "maxCombinedClipAndCullDistances smaller than the minimum required by the spec","")
      ;
      pTVar7 = local_748;
      local_748->m_code = QP_TEST_RESULT_FAIL;
      (local_748->m_description)._M_dataplus._M_p = (pointer)&(local_748->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_748->m_description,local_510,
                 (char *)((long)local_510 + CONCAT44(fStack_504,local_508)));
    }
    else {
      local_510 = (undefined1  [8])local_500;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_510,
                 "maxCullDistances smaller than the minimum required by the spec","");
      pTVar7 = local_748;
      local_748->m_code = QP_TEST_RESULT_FAIL;
      (local_748->m_description)._M_dataplus._M_p = (pointer)&(local_748->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_748->m_description,local_510,
                 (char *)((long)local_510 + CONCAT44(fStack_504,local_508)));
    }
  }
  else {
    local_510 = (undefined1  [8])local_500;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_510,"maxClipDistances smaller than the minimum required by the spec",
               "");
    pTVar7 = local_748;
    local_748->m_code = QP_TEST_RESULT_FAIL;
    (local_748->m_description)._M_dataplus._M_p = (pointer)&(local_748->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_748->m_description,local_510,
               (char *)((long)local_510 + CONCAT44(fStack_504,local_508)));
  }
  if (local_510 == (undefined1  [8])local_500) {
    return pTVar7;
  }
  uVar8 = local_500[0]._M_allocated_capacity + 1;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_510;
LAB_003b9ef1:
  operator_delete(paVar9,uVar8);
  return pTVar7;
}

Assistant:

tcu::TestStatus testClipDistance (Context& context, const CaseDefinition caseDef)
{
	// Check test requirements
	{
		const InstanceInterface&		vki			= context.getInstanceInterface();
		const VkPhysicalDevice			physDevice	= context.getPhysicalDevice();
		const VkPhysicalDeviceLimits	limits		= getPhysicalDeviceProperties(vki, physDevice).limits;

		FeatureFlags requirements = (FeatureFlags)0;

		if (caseDef.numClipDistances > 0)
			requirements |= FEATURE_SHADER_CLIP_DISTANCE;
		if (caseDef.numCullDistances > 0)
			requirements |= FEATURE_SHADER_CULL_DISTANCE;
		if (caseDef.enableTessellation)
			requirements |= FEATURE_TESSELLATION_SHADER;
		if (caseDef.enableGeometry)
			requirements |= FEATURE_GEOMETRY_SHADER;

		requireFeatures(vki, physDevice, requirements);

		// Check limits for supported features

		if (caseDef.numClipDistances > 0 && limits.maxClipDistances < MAX_CLIP_DISTANCES)
			return tcu::TestStatus::fail("maxClipDistances smaller than the minimum required by the spec");
		if (caseDef.numCullDistances > 0 && limits.maxCullDistances < MAX_CULL_DISTANCES)
			return tcu::TestStatus::fail("maxCullDistances smaller than the minimum required by the spec");
		if (caseDef.numCullDistances > 0 && limits.maxCombinedClipAndCullDistances < MAX_COMBINED_CLIP_AND_CULL_DISTANCES)
			return tcu::TestStatus::fail("maxCombinedClipAndCullDistances smaller than the minimum required by the spec");
	}

	std::vector<Shader> shaders;
	shaders.push_back(Shader(VK_SHADER_STAGE_VERTEX_BIT,	context.getBinaryCollection().get("vert")));
	shaders.push_back(Shader(VK_SHADER_STAGE_FRAGMENT_BIT,	context.getBinaryCollection().get("frag")));
	if (caseDef.enableTessellation)
	{
		shaders.push_back(Shader(VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,		context.getBinaryCollection().get("tesc")));
		shaders.push_back(Shader(VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,	context.getBinaryCollection().get("tese")));
	}
	if (caseDef.enableGeometry)
		shaders.push_back(Shader(VK_SHADER_STAGE_GEOMETRY_BIT,	context.getBinaryCollection().get("geom")));

	const int numBars = MAX_COMBINED_CLIP_AND_CULL_DISTANCES;

	std::vector<Vec4> vertices;
	{
		const float	dx = 2.0f / numBars;
		for (int i = 0; i < numBars; ++i)
		{
			const float x = -1.0f + dx * static_cast<float>(i);

			vertices.push_back(Vec4(x,      -1.0f, 0.0f, 1.0f));
			vertices.push_back(Vec4(x,       1.0f, 0.0f, 1.0f));
			vertices.push_back(Vec4(x + dx, -1.0f, 0.0f, 1.0f));

			vertices.push_back(Vec4(x,       1.0f, 0.0f, 1.0f));
			vertices.push_back(Vec4(x + dx,  1.0f, 0.0f, 1.0f));
			vertices.push_back(Vec4(x + dx, -1.0f, 0.0f, 1.0f));
		}
	}

	tcu::TestLog& log = context.getTestContext().getLog();

	log << tcu::TestLog::Message << "Drawing " << numBars << " colored bars, clipping the first " << caseDef.numClipDistances << tcu::TestLog::EndMessage
		<< tcu::TestLog::Message << "Using " << caseDef.numClipDistances << " ClipDistance(s) and " << caseDef.numCullDistances << " CullDistance(s)" << tcu::TestLog::EndMessage
		<< tcu::TestLog::Message << "Expecting upper half of the clipped bars to be black." << tcu::TestLog::EndMessage;

	DrawState			drawState		(caseDef.topology, RENDER_SIZE, RENDER_SIZE);
	DrawCallData		drawCallData	(vertices);
	VulkanProgram		vulkanProgram	(shaders);

	if (caseDef.enableTessellation)
		drawState.numPatchControlPoints = NUM_PATCH_CONTROL_POINTS;

	VulkanDrawContext	drawContext(context, drawState, drawCallData, vulkanProgram);
	drawContext.draw();

	// Count black pixels in the whole image.
	const int numBlackPixels		= countPixels(drawContext.getColorPixels(), Vec4(0.0f, 0.0f, 0.0f, 1.0f), Vec4());
	const IVec2	clipRegion			= IVec2(caseDef.numClipDistances * RENDER_SIZE / numBars, RENDER_SIZE / 2);
	const int expectedClippedPixels	= clipRegion.x() * clipRegion.y();
	// Make sure the bottom half has no black pixels (possible if image became corrupted).
	const int guardPixels			= countPixels(drawContext.getColorPixels(), IVec2(0, RENDER_SIZE/2), clipRegion, Vec4(0.0f, 0.0f, 0.0f, 1.0f), Vec4());

	return (numBlackPixels == expectedClippedPixels && guardPixels == 0 ? tcu::TestStatus::pass("OK")
																		: tcu::TestStatus::fail("Rendered image(s) are incorrect"));
}